

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O0

int32_t MsgHelper::deserializeMsg(uint8_t *buf,uint32_t len,PipeMsg *msg)

{
  uint8_t uVar1;
  bool bVar2;
  int32_t iVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint32_t dataLen_1;
  int32_t addrlen_1;
  uint8_t ADDR_LEN_1;
  uint8_t ATYP_1;
  uint32_t msgLen_2;
  uint32_t dataLen;
  uint32_t msgLen_1;
  int32_t addrlen;
  int msgLen;
  uint8_t ADDR_LEN;
  uint8_t ATYP;
  PipeMsg *msg_local;
  uint32_t len_local;
  uint8_t *buf_local;
  
  msg->type = *buf;
  switch(msg->type) {
  case C2S_REQUEST:
    if (len < 2) {
      buf_local._4_4_ = 0;
    }
    else {
      bVar2 = check_cmd(buf[1]);
      if (bVar2) {
        if (len < 3) {
          buf_local._4_4_ = 0;
        }
        else {
          uVar1 = buf[2];
          bVar2 = check_atyp(uVar1);
          if (bVar2) {
            if (len < 9) {
              buf_local._4_4_ = 0;
            }
            else {
              addrlen._2_1_ = 4;
              if (uVar1 == '\x03') {
                if (buf[3] == '\0') {
                  return -1;
                }
                addrlen._2_1_ = buf[3] + 1;
              }
              else if (uVar1 == '\x04') {
                addrlen._2_1_ = 0x10;
              }
              buf_local._4_4_ = addrlen._2_1_ + 5;
              if (len < buf_local._4_4_) {
                buf_local._4_4_ = 0;
              }
              else {
                (msg->field_1).c2s_request.CMD = buf[1];
                iVar3 = resolvAddr(&(msg->field_1).c2s_request.ADDR,buf + 2);
                if (iVar3 < 1) {
                  buf_local._4_4_ = 0xffffffff;
                }
                else if (iVar3 + 2U != buf_local._4_4_) {
                  buf_local._4_4_ = 0xffffffff;
                }
              }
            }
          }
          else {
            buf_local._4_4_ = 0xffffffff;
          }
        }
      }
      else {
        buf_local._4_4_ = 0xffffffff;
      }
    }
    break;
  case S2C_RESPONSE:
    if (len < 2) {
      buf_local._4_4_ = 0;
    }
    else if (buf[1] < 5) {
      (msg->field_1).c2s_request.CMD = buf[1];
      buf_local._4_4_ = 2;
    }
    else {
      buf_local._4_4_ = 0xffffffff;
    }
    break;
  case SEND_TCP_DATA:
    if (len < 2) {
      buf_local._4_4_ = 0;
    }
    else {
      bVar2 = check_method(buf[1]);
      if (bVar2) {
        if (len < 6) {
          buf_local._4_4_ = 0;
        }
        else {
          buf_local._4_4_ = readUint32InBigEndian(buf + 2);
          if ((buf_local._4_4_ < 7) || (0x40000 < buf_local._4_4_)) {
            buf_local._4_4_ = 0xffffffff;
          }
          else if (len < buf_local._4_4_) {
            buf_local._4_4_ = 0;
          }
          else {
            *(uint8_t *)&(msg->field_1).c2s_request.ADDR.PORT = buf[1];
            uVar4 = buf_local._4_4_ - 6;
            (msg->field_1).common_tcp_data.LEN = uVar4;
            puVar5 = (uint8_t *)malloc((ulong)uVar4);
            (msg->field_1).common_tcp_data.DATA = puVar5;
            memcpy((msg->field_1).common_tcp_data.DATA,buf + 6,(ulong)uVar4);
          }
        }
      }
      else {
        buf_local._4_4_ = 0xffffffff;
      }
    }
    break;
  case C2S_UDP_DATA:
  case S2C_UDP_DATA:
    if (len < 2) {
      buf_local._4_4_ = 0;
    }
    else {
      bVar2 = check_method(buf[1]);
      if (bVar2) {
        if (len < 7) {
          buf_local._4_4_ = 0;
        }
        else {
          buf_local._4_4_ = readUint32InBigEndian(buf + 2);
          if ((buf_local._4_4_ < 0xe) || (0x40000 < buf_local._4_4_)) {
            buf_local._4_4_ = 0xffffffff;
          }
          else {
            uVar1 = buf[6];
            bVar2 = check_atyp(uVar1);
            if (bVar2) {
              if (len < 8) {
                buf_local._4_4_ = 0;
              }
              else {
                dataLen_1._2_1_ = 4;
                if (uVar1 == '\x03') {
                  if (buf[7] == '\0') {
                    return -1;
                  }
                  dataLen_1._2_1_ = buf[7] + 1;
                }
                else if (uVar1 == '\x04') {
                  dataLen_1._2_1_ = 0x10;
                }
                if ((dataLen_1._2_1_ + 9 < buf_local._4_4_) && (buf_local._4_4_ < 0x40001)) {
                  if (len < buf_local._4_4_) {
                    buf_local._4_4_ = 0;
                  }
                  else {
                    *(uint8_t *)&(msg->field_1).c2s_request.ADDR.PORT = buf[1];
                    iVar3 = resolvAddr((S5AddrInfo *)((msg->field_1).c2s_request.ADDR.ADDR + 10),
                                       buf + 6);
                    if ((iVar3 < 1) || (iVar3 != dataLen_1._2_1_ + 3)) {
                      buf_local._4_4_ = 0xffffffff;
                    }
                    else {
                      uVar4 = (buf_local._4_4_ - iVar3) - 6;
                      if (uVar4 == 0) {
                        buf_local._4_4_ = 0xffffffff;
                      }
                      else {
                        (msg->field_1).common_tcp_data.LEN = uVar4;
                        puVar5 = (uint8_t *)malloc((ulong)uVar4);
                        (msg->field_1).common_tcp_data.DATA = puVar5;
                        memcpy((msg->field_1).common_tcp_data.DATA,buf + (long)iVar3 + 6,
                               (ulong)uVar4);
                      }
                    }
                  }
                }
                else {
                  buf_local._4_4_ = 0xffffffff;
                }
              }
            }
            else {
              buf_local._4_4_ = 0xffffffff;
            }
          }
        }
      }
      else {
        buf_local._4_4_ = 0xffffffff;
      }
    }
    break;
  case S2C_DISCONNECT:
    buf_local._4_4_ = 1;
    break;
  case S2C_CANNOT_RESOLVE_ADDR:
    buf_local._4_4_ = 1;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/PipeMsg.cpp"
                  ,0x115,
                  "static int32_t MsgHelper::deserializeMsg(const uint8_t *, uint32_t, PipeMsg *)");
  }
  return buf_local._4_4_;
}

Assistant:

int32_t MsgHelper::deserializeMsg(const uint8_t* buf, uint32_t len, PipeMsg* msg)
{
	msg->type = (PIPEMSG_TYPE)buf[0];
	switch(msg->type)
	{
		case PIPEMSG_TYPE::C2S_REQUEST:
		{
			if (len < 2)
				return WAITE_MSG;

			if (false == check_cmd(buf[1]))
				return INVALID_MSG;

			if (len < 3)
				return WAITE_MSG;

			uint8_t ATYP = buf[2];
			if (false == check_atyp(ATYP))
				return INVALID_MSG;

			if (len < 9)
				return WAITE_MSG;

			uint8_t ADDR_LEN = 4;
			if (ATYP == SOKS5_ATYP_DOMAIN)
			{
				if (buf[3] <= 0)
					return INVALID_MSG;
				ADDR_LEN = buf[3] + 1;
			}
			else if (ATYP == SOKS5_ATYP_IPV6)
			{
				ADDR_LEN = 16;
			}

			int msgLen = 3 + ADDR_LEN + 2;
			if (len < msgLen)
				return WAITE_MSG;

			msg->c2s_request.CMD = buf[1];
			auto addrlen = resolvAddr(&msg->c2s_request.ADDR, (uint8_t*)&buf[2]);
			if(addrlen <= 0)
				return INVALID_MSG;

			if (addrlen + 2 == msgLen)
				return msgLen;

			return INVALID_MSG;
		}break;
		case PIPEMSG_TYPE::S2C_RESPONSE:
		{
			if (len >= 2)
			{
				if (buf[1] >= 0 && buf[1] < S2C_RESPONSE_CODE::CODE_NONE)
				{
					msg->s2c_response.CODE = (S2C_RESPONSE_CODE)buf[1];
					return 2;
				}
				return INVALID_MSG;
			}
			return WAITE_MSG;
		}break;
		case PIPEMSG_TYPE::SEND_TCP_DATA:
		{
			if (len < 2)
				return WAITE_MSG;

			if (check_method(buf[1]) == false)
				return INVALID_MSG;

			if (len < 6)
				return WAITE_MSG;

			uint32_t msgLen = (uint32_t)readUint32InBigEndian((void*)&buf[2]);
			if (msgLen <= 6 || msgLen > MSG_MAX_SIZE)
				return INVALID_MSG;

			if (len < msgLen)
				return WAITE_MSG;

			msg->common_tcp_data.METHOD = buf[1];

			auto dataLen = msgLen - 6;

			msg->common_tcp_data.LEN = dataLen;
			msg->common_tcp_data.DATA = (uint8_t*)fc_malloc(dataLen);
			memcpy(msg->common_tcp_data.DATA, buf + 6, dataLen);

			return msgLen;

		}break;
		case PIPEMSG_TYPE::C2S_UDP_DATA:
		case PIPEMSG_TYPE::S2C_UDP_DATA:
		{
			if (len < 2)
				return WAITE_MSG;

			if (check_method(buf[1]) == false)
				return INVALID_MSG;

			if (len < 7)
				return WAITE_MSG;

			uint32_t msgLen = (uint32_t)readUint32InBigEndian((void*)&buf[2]);
			if (msgLen <= 13 || msgLen > MSG_MAX_SIZE)
				return INVALID_MSG;

			uint8_t ATYP = buf[6];
			if (false == check_atyp(ATYP))
				return INVALID_MSG;

			if (len < 8)
				return WAITE_MSG;

			uint8_t ADDR_LEN = 4;
			if (ATYP == SOKS5_ATYP_DOMAIN)
			{
				if (buf[7] <= 0)
					return INVALID_MSG;
				ADDR_LEN = buf[7] + 1;
			}
			else if (ATYP == SOKS5_ATYP_IPV6)
			{
				ADDR_LEN = 16;
			}

			if (msgLen <= 9 + ADDR_LEN || msgLen > MSG_MAX_SIZE)
				return INVALID_MSG;

			if (len < msgLen)
				return WAITE_MSG;
			
			msg->common_udp_data.METHOD = buf[1];
				
			auto addrlen = resolvAddr(&msg->common_udp_data.ADDR, (uint8_t*)&buf[6]);
			if (addrlen <= 0 || addrlen != ADDR_LEN + 3)
				return INVALID_MSG;

			auto dataLen = msgLen - addrlen - 6;
			if (dataLen <= 0)
				return INVALID_MSG;

			msg->common_udp_data.LEN = dataLen;
			msg->common_udp_data.DATA = (uint8_t*)fc_malloc(dataLen);
			memcpy(msg->common_udp_data.DATA, buf + 6 + addrlen, dataLen);

			return msgLen;
		}break;
		case PIPEMSG_TYPE::S2C_DISCONNECT:
		{
			return 1;
		}break;
		case PIPEMSG_TYPE::S2C_CANNOT_RESOLVE_ADDR:
		{
			return 1;
		}break;
	}
	assert(0);
	return INVALID_MSG;
}